

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Op __thiscall spv::Builder::getMostBasicTypeClass(Builder *this,Id typeId)

{
  Id IVar1;
  Instruction *this_00;
  Op typeClass;
  Instruction *instr;
  Id typeId_local;
  Builder *this_local;
  
  this_00 = Module::getInstruction(&this->module,typeId);
  this_local._4_4_ = Instruction::getOpCode(this_00);
  if (3 < this_local._4_4_ - OpTypeVoid) {
    if ((this_local._4_4_ - OpTypeVector < 2) || (this_local._4_4_ - OpTypeArray < 2)) {
      IVar1 = Instruction::getIdOperand(this_00,0);
      this_local._4_4_ = getMostBasicTypeClass(this,IVar1);
    }
    else if (this_local._4_4_ != OpTypeStruct) {
      if (this_local._4_4_ != OpTypePointer) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                      ,0x25f,"Op spv::Builder::getMostBasicTypeClass(Id) const");
      }
      IVar1 = Instruction::getIdOperand(this_00,1);
      this_local._4_4_ = getMostBasicTypeClass(this,IVar1);
    }
  }
  return this_local._4_4_;
}

Assistant:

Op Builder::getMostBasicTypeClass(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    Op typeClass = instr->getOpCode();
    switch (typeClass)
    {
    case OpTypeVoid:
    case OpTypeBool:
    case OpTypeInt:
    case OpTypeFloat:
    case OpTypeStruct:
        return typeClass;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return getMostBasicTypeClass(instr->getIdOperand(0));
    case OpTypePointer:
        return getMostBasicTypeClass(instr->getIdOperand(1));
    default:
        assert(0);
        return OpTypeFloat;
    }
}